

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v7::detail::utf8_to_utf16::utf8_to_utf16(utf8_to_utf16 *this,string_view s)

{
  size_t sVar1;
  char *pcVar2;
  type __n;
  wchar_t local_6c [3];
  char buf [7];
  long num_chars_left;
  char *end;
  size_t block_size;
  char *p;
  anon_class_8_1_8991fb9c transcode;
  allocator<wchar_t> local_21;
  utf8_to_utf16 *local_20;
  utf8_to_utf16 *this_local;
  string_view s_local;
  
  s_local.data_ = (char *)s.size_;
  this_local = (utf8_to_utf16 *)s.data_;
  local_20 = this;
  std::allocator<wchar_t>::allocator();
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::basic_memory_buffer
            (&this->buffer_,&local_21);
  std::allocator<wchar_t>::~allocator(&local_21);
  p = (char *)this;
  block_size = (size_t)basic_string_view<char>::data((basic_string_view<char> *)&this_local);
  sVar1 = basic_string_view<char>::size((basic_string_view<char> *)&this_local);
  if (3 < sVar1) {
    sVar1 = basic_string_view<char>::size((basic_string_view<char> *)&this_local);
    pcVar2 = (char *)(block_size + (sVar1 - 3));
    for (; block_size < pcVar2;
        block_size = (size_t)utf8_to_utf16::anon_class_8_1_8991fb9c::operator()
                                       ((anon_class_8_1_8991fb9c *)&p,(char *)block_size)) {
    }
  }
  pcVar2 = basic_string_view<char>::data((basic_string_view<char> *)&this_local);
  sVar1 = basic_string_view<char>::size((basic_string_view<char> *)&this_local);
  _buf = pcVar2 + (sVar1 - block_size);
  if (_buf != (char *)0x0) {
    local_6c[2]._0_3_ = 0;
    local_6c[1] = 0;
    __n = to_unsigned<long>((long)_buf);
    memcpy(local_6c + 1,(void *)block_size,__n);
    block_size = (size_t)(local_6c + 1);
    do {
      block_size = (size_t)utf8_to_utf16::anon_class_8_1_8991fb9c::operator()
                                     ((anon_class_8_1_8991fb9c *)&p,(char *)block_size);
    } while ((long)(block_size - (long)(local_6c + 1)) < (long)_buf);
  }
  local_6c[0] = L'\0';
  buffer<wchar_t>::push_back((buffer<wchar_t> *)this,local_6c);
  return;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  auto transcode = [this](const char* p) {
    auto cp = uint32_t();
    auto error = 0;
    p = utf8_decode(p, &cp, &error);
    if (error != 0) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return p;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) p = transcode(p);
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    memcpy(buf, p, to_unsigned(num_chars_left));
    p = buf;
    do {
      p = transcode(p);
    } while (p - buf < num_chars_left);
  }
  buffer_.push_back(0);
}